

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFireSuppressionTerminalType::IfcFireSuppressionTerminalType
          (IfcFireSuppressionTerminalType *this)

{
  IfcFireSuppressionTerminalType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1e0,"IfcFireSuppressionTerminalType");
  Schema_2x3::IfcFlowTerminalType::IfcFlowTerminalType
            (&this->super_IfcFlowTerminalType,&PTR_construction_vtable_24__00ef97f0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFireSuppressionTerminalType,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFireSuppressionTerminalType,_1UL> *)
             &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.field_0x1b0,
             &PTR_construction_vtable_24__00ef99d0);
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0xef9670;
  *(undefined8 *)&this->field_0x1e0 = 0xef97d8;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0xef9698;
  (this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xef96c0;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0xef96e8;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0xef9710;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0xef9738;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0xef9760;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0xef9788;
  *(undefined8 *)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0xef97b0;
  std::__cxx11::string::string((string *)&(this->super_IfcFlowTerminalType).field_0x1c0);
  return;
}

Assistant:

IfcFireSuppressionTerminalType() : Object("IfcFireSuppressionTerminalType") {}